

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsOptions.cpp
# Opt level: O3

OptionStatus
checkOptionValue(HighsLogOptions *report_log_options,OptionRecordDouble *option,double value)

{
  pointer pcVar1;
  char *format;
  
  if (option->lower_bound <= value) {
    if (value <= option->upper_bound) {
      return kOk;
    }
    pcVar1 = (option->super_OptionRecord).name._M_dataplus._M_p;
    format = "checkOptionValue: Value %g for option \"%s\" is above upper bound of %g\n";
  }
  else {
    pcVar1 = (option->super_OptionRecord).name._M_dataplus._M_p;
    format = "checkOptionValue: Value %g for option \"%s\" is below lower bound of %g\n";
  }
  highsLogUser(report_log_options,kWarning,format,pcVar1);
  return kIllegalValue;
}

Assistant:

OptionStatus checkOptionValue(const HighsLogOptions& report_log_options,
                              OptionRecordDouble& option, const double value) {
  if (value < option.lower_bound) {
    highsLogUser(report_log_options, HighsLogType::kWarning,
                 "checkOptionValue: Value %g for option \"%s\" is below "
                 "lower bound of %g\n",
                 value, option.name.c_str(), option.lower_bound);
    return OptionStatus::kIllegalValue;
  } else if (value > option.upper_bound) {
    highsLogUser(report_log_options, HighsLogType::kWarning,
                 "checkOptionValue: Value %g for option \"%s\" is above "
                 "upper bound of %g\n",
                 value, option.name.c_str(), option.upper_bound);
    return OptionStatus::kIllegalValue;
  }
  return OptionStatus::kOk;
}